

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar10;
  MessageGenerator *pMVar11;
  Descriptor *descriptor;
  size_type sVar12;
  reference ppMVar13;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar14;
  EnumGenerator *this_00;
  EnumDescriptor *descriptor_00;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *psVar15;
  ServiceGenerator *this_01;
  ServiceDescriptor *descriptor_01;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar16;
  ExtensionGenerator *this_02;
  FieldDescriptor *descriptor_02;
  string *full;
  ulong uVar17;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *local_1c0;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *local_178;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *local_130;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  ExtensionGenerator *local_60;
  int local_54;
  ServiceGenerator *pSStack_50;
  int i_4;
  int local_44;
  EnumGenerator *pEStack_40;
  int i_3;
  int local_38;
  int local_34;
  int i_2;
  int i_1;
  int i;
  Options *local_20;
  Options *options_local;
  FileDescriptor *file_local;
  FileGenerator *this_local;
  
  this->file_ = file;
  local_20 = options;
  options_local = (Options *)file;
  file_local = (FileDescriptor *)this;
  Options::Options(&this->options_,options);
  SCCAnalyzer::SCCAnalyzer(&this->scc_analyzer_,local_20);
  std::
  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ::vector(&this->message_generators_);
  std::
  vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ::vector(&this->enum_generators_);
  std::
  vector<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ::vector(&this->service_generators_);
  std::
  vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ::vector(&this->extension_generators_);
  iVar5 = FileDescriptor::message_type_count((FileDescriptor *)options_local);
  uVar7 = (ulong)iVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  uVar8 = SUB168(auVar1 * ZEXT816(8),0);
  uVar17 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar17 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar17);
  *puVar9 = uVar7;
  psVar10 = (scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_e8 = psVar10;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::scoped_ptr
                (local_e8,(MessageGenerator *)0x0);
      local_e8 = local_e8 + 1;
    } while (local_e8 != psVar10 + uVar7);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
  ::scoped_array(&this->message_generators_owner_,psVar10);
  iVar5 = FileDescriptor::enum_type_count((FileDescriptor *)options_local);
  uVar7 = (ulong)iVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar8 = SUB168(auVar2 * ZEXT816(8),0);
  uVar17 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar17 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar17);
  *puVar9 = uVar7;
  psVar14 = (scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_130 = psVar14;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::scoped_ptr
                (local_130,(EnumGenerator *)0x0);
      local_130 = local_130 + 1;
    } while (local_130 != psVar14 + uVar7);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
  ::scoped_array(&this->enum_generators_owner_,psVar14);
  iVar5 = FileDescriptor::service_count((FileDescriptor *)options_local);
  uVar7 = (ulong)iVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  uVar8 = SUB168(auVar3 * ZEXT816(8),0);
  uVar17 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar17 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar17);
  *puVar9 = uVar7;
  psVar15 = (scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_178 = psVar15;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::scoped_ptr
                (local_178,(ServiceGenerator *)0x0);
      local_178 = local_178 + 1;
    } while (local_178 != psVar15 + uVar7);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
  ::scoped_array(&this->service_generators_owner_,psVar15);
  iVar5 = FileDescriptor::extension_count((FileDescriptor *)options_local);
  uVar7 = (ulong)iVar5;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar8 = SUB168(auVar4 * ZEXT816(8),0);
  uVar17 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar17 = 0xffffffffffffffff;
  }
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar17);
  *puVar9 = uVar7;
  psVar16 = (scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_1c0 = psVar16;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::scoped_ptr
                (local_1c0,(ExtensionGenerator *)0x0);
      local_1c0 = local_1c0 + 1;
    } while (local_1c0 != psVar16 + uVar7);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
  ::scoped_array(&this->extension_generators_owner_,psVar16);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->package_parts_);
  i_2 = 0;
  while( true ) {
    iVar5 = i_2;
    iVar6 = FileDescriptor::message_type_count((FileDescriptor *)options_local);
    if (iVar6 <= iVar5) break;
    psVar10 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator[](&this->message_generators_owner_,(long)i_2);
    pMVar11 = (MessageGenerator *)operator_new(0x118);
    descriptor = FileDescriptor::message_type((FileDescriptor *)options_local,i_2);
    MessageGenerator::MessageGenerator(pMVar11,descriptor,local_20,&this->scc_analyzer_);
    internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::reset(psVar10,pMVar11);
    psVar10 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator[](&this->message_generators_owner_,(long)i_2);
    pMVar11 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                        (psVar10);
    MessageGenerator::Flatten(pMVar11,&this->message_generators_);
    i_2 = i_2 + 1;
  }
  local_34 = 0;
  while( true ) {
    uVar7 = (ulong)local_34;
    sVar12 = std::
             vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
             ::size(&this->message_generators_);
    if (sVar12 <= uVar7) break;
    ppMVar13 = std::
               vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
               ::operator[](&this->message_generators_,(long)local_34);
    MessageGenerator::AddGenerators(*ppMVar13,&this->enum_generators_,&this->extension_generators_);
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    iVar5 = local_38;
    iVar6 = FileDescriptor::enum_type_count((FileDescriptor *)options_local);
    if (iVar6 <= iVar5) break;
    psVar14 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
              ::operator[](&this->enum_generators_owner_,(long)local_38);
    this_00 = (EnumGenerator *)operator_new(0x38);
    descriptor_00 = FileDescriptor::enum_type((FileDescriptor *)options_local,local_38);
    EnumGenerator::EnumGenerator(this_00,descriptor_00,local_20);
    internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::reset(psVar14,this_00);
    psVar14 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
              ::operator[](&this->enum_generators_owner_,(long)local_38);
    pEStack_40 = internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::get(psVar14);
    std::
    vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
    ::push_back(&this->enum_generators_,&stack0xffffffffffffffc0);
    local_38 = local_38 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar5 = local_44;
    iVar6 = FileDescriptor::service_count((FileDescriptor *)options_local);
    if (iVar6 <= iVar5) break;
    psVar15 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
              ::operator[](&this->service_generators_owner_,(long)local_44);
    this_01 = (ServiceGenerator *)operator_new(0x40);
    descriptor_01 = FileDescriptor::service((FileDescriptor *)options_local,local_44);
    ServiceGenerator::ServiceGenerator(this_01,descriptor_01,local_20);
    internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::reset(psVar15,this_01);
    psVar15 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
              ::operator[](&this->service_generators_owner_,(long)local_44);
    pSStack_50 = internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::get
                           (psVar15);
    std::
    vector<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
    ::push_back(&this->service_generators_,&stack0xffffffffffffffb0);
    local_44 = local_44 + 1;
  }
  local_54 = 0;
  while( true ) {
    iVar5 = local_54;
    iVar6 = FileDescriptor::extension_count((FileDescriptor *)options_local);
    if (iVar6 <= iVar5) break;
    psVar16 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_owner_,(long)local_54);
    this_02 = (ExtensionGenerator *)operator_new(0x90);
    descriptor_02 = FileDescriptor::extension((FileDescriptor *)options_local,local_54);
    ExtensionGenerator::ExtensionGenerator(this_02,descriptor_02,local_20);
    internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::reset
              (psVar16,this_02);
    psVar16 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_owner_,(long)local_54);
    local_60 = internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::get
                         (psVar16);
    std::
    vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
    ::push_back(&this->extension_generators_,&local_60);
    local_54 = local_54 + 1;
  }
  full = FileDescriptor::package_abi_cxx11_(this->file_);
  Split(&local_78,full,".",true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->package_parts_,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options)
    : file_(file),
      options_(options),
      scc_analyzer_(options),
      message_generators_owner_(
          new google::protobuf::scoped_ptr<MessageGenerator>[file->message_type_count()]),
      enum_generators_owner_(
          new google::protobuf::scoped_ptr<EnumGenerator>[file->enum_type_count()]),
      service_generators_owner_(
          new google::protobuf::scoped_ptr<ServiceGenerator>[file->service_count()]),
      extension_generators_owner_(
          new google::protobuf::scoped_ptr<ExtensionGenerator>[file->extension_count()]) {

  for (int i = 0; i < file->message_type_count(); i++) {
    message_generators_owner_[i].reset(
        new MessageGenerator(file->message_type(i), options, &scc_analyzer_));
    message_generators_owner_[i]->Flatten(&message_generators_);
  }

  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->AddGenerators(&enum_generators_,
                                          &extension_generators_);
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_owner_[i].reset(
        new EnumGenerator(file->enum_type(i), options));
    enum_generators_.push_back(enum_generators_owner_[i].get());
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_owner_[i].reset(
        new ServiceGenerator(file->service(i), options));
    service_generators_.push_back(service_generators_owner_[i].get());
  }

  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_owner_[i].reset(
        new ExtensionGenerator(file->extension(i), options));
    extension_generators_.push_back(extension_generators_owner_[i].get());
  }

  package_parts_ = Split(file_->package(), ".", true);
}